

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O0

int Llb_Nonlin4Quantify1(Llb_Mgr_t_conflict *p,Llb_Prt_t *pPart)

{
  DdNode *f;
  int iVar1;
  int iVar2;
  DdNode *n;
  DdNode *pDVar3;
  Vec_Ptr_t *p_00;
  Llb_Var_t *pVar_00;
  Llb_Prt_t *pLVar4;
  int nSizeNew;
  int RetValue;
  int i;
  DdNode *bTemp;
  DdNode *bCube;
  Vec_Ptr_t *vSingles;
  Llb_Prt_t *pTemp;
  Llb_Var_t *pVar;
  Llb_Prt_t *pPart_local;
  Llb_Mgr_t_conflict *p_local;
  
  n = Llb_Nonlin4CreateCube1(p,pPart);
  Cudd_Ref(n);
  f = pPart->bFunc;
  pDVar3 = Cudd_bddExistAbstract(p->dd,f,n);
  pPart->bFunc = pDVar3;
  Cudd_Ref(pPart->bFunc);
  Cudd_RecursiveDeref(p->dd,f);
  Cudd_RecursiveDeref(p->dd,n);
  p_00 = Vec_PtrAlloc(0);
  iVar1 = Cudd_DagSize(pPart->bFunc);
  Extra_SupportArray(p->dd,pPart->bFunc,p->pSupp);
  nSizeNew = 0;
  do {
    iVar2 = Vec_IntSize(pPart->vVars);
    if (iVar2 <= nSizeNew) {
      pPart->nSize = iVar1;
      Vec_IntClear(pPart->vVars);
      for (nSizeNew = 0; nSizeNew < p->nVars; nSizeNew = nSizeNew + 1) {
        if ((p->pSupp[nSizeNew] != 0) && (iVar1 = Vec_IntEntry(p->vVars2Q,nSizeNew), iVar1 != 0)) {
          Vec_IntPush(pPart->vVars,nSizeNew);
        }
      }
      for (nSizeNew = 0; iVar1 = Vec_PtrSize(p_00), nSizeNew < iVar1; nSizeNew = nSizeNew + 1) {
        pLVar4 = (Llb_Prt_t *)Vec_PtrEntry(p_00,nSizeNew);
        Llb_Nonlin4Quantify1(p,pLVar4);
      }
      Vec_PtrFree(p_00);
      return 0;
    }
    iVar2 = Vec_IntEntry(pPart->vVars,nSizeNew);
    pVar_00 = Llb_MgrVar(p,iVar2);
    if (p->pSupp[pVar_00->iVar] == 0) {
      iVar2 = Vec_IntRemove(pVar_00->vParts,pPart->iPart);
      if (iVar2 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb4Image.c"
                      ,0x120,"int Llb_Nonlin4Quantify1(Llb_Mgr_t *, Llb_Prt_t *)");
      }
      pVar_00->nScore = pVar_00->nScore - pPart->nSize;
      iVar2 = Vec_IntSize(pVar_00->vParts);
      if (iVar2 == 0) {
        Llb_Nonlin4RemoveVar(p,pVar_00);
      }
      else {
        iVar2 = Vec_IntSize(pVar_00->vParts);
        if (iVar2 == 1) {
          iVar2 = Vec_IntEntry(pVar_00->vParts,0);
          pLVar4 = Llb_MgrPart(p,iVar2);
          Vec_PtrPushUnique(p_00,pLVar4);
        }
      }
    }
    else {
      iVar2 = Vec_IntSize(pVar_00->vParts);
      if (iVar2 < 2) {
        __assert_fail("Vec_IntSize(pVar->vParts) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb4Image.c"
                      ,0x11a,"int Llb_Nonlin4Quantify1(Llb_Mgr_t *, Llb_Prt_t *)");
      }
      pVar_00->nScore = pVar_00->nScore - (pPart->nSize - iVar1);
    }
    nSizeNew = nSizeNew + 1;
  } while( true );
}

Assistant:

int Llb_Nonlin4Quantify1( Llb_Mgr_t * p, Llb_Prt_t * pPart )
{
    Llb_Var_t * pVar;
    Llb_Prt_t * pTemp;
    Vec_Ptr_t * vSingles;
    DdNode * bCube, * bTemp;
    int i, RetValue, nSizeNew;
    // create cube to be quantified
    bCube = Llb_Nonlin4CreateCube1( p, pPart );   Cudd_Ref( bCube );
//    assert( !Cudd_IsConstant(bCube) );
    // derive new function
    pPart->bFunc = Cudd_bddExistAbstract( p->dd, bTemp = pPart->bFunc, bCube );  Cudd_Ref( pPart->bFunc );
    Cudd_RecursiveDeref( p->dd, bTemp );
    Cudd_RecursiveDeref( p->dd, bCube );
    // get support
    vSingles = Vec_PtrAlloc( 0 );
    nSizeNew = Cudd_DagSize(pPart->bFunc);
    Extra_SupportArray( p->dd, pPart->bFunc, p->pSupp );
    Llb_PartForEachVar( p, pPart, pVar, i )
        if ( p->pSupp[pVar->iVar] )
        {
            assert( Vec_IntSize(pVar->vParts) > 1 );
            pVar->nScore -= pPart->nSize - nSizeNew;
        }
        else
        {
            RetValue = Vec_IntRemove( pVar->vParts, pPart->iPart );
            assert( RetValue );
            pVar->nScore -= pPart->nSize;
            if ( Vec_IntSize(pVar->vParts) == 0 )
                Llb_Nonlin4RemoveVar( p, pVar );
            else if ( Vec_IntSize(pVar->vParts) == 1 )
                Vec_PtrPushUnique( vSingles, Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0)) );
        }

    // update partition
    pPart->nSize = nSizeNew;
    Vec_IntClear( pPart->vVars );
    for ( i = 0; i < p->nVars; i++ )
        if ( p->pSupp[i] && Vec_IntEntry(p->vVars2Q, i) )
            Vec_IntPush( pPart->vVars, i );
    // remove other variables
    Vec_PtrForEachEntry( Llb_Prt_t *, vSingles, pTemp, i )
        Llb_Nonlin4Quantify1( p, pTemp );
    Vec_PtrFree( vSingles );
    return 0;
}